

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::writeThemeIconCheckAssignment
          (WriteInitialization *this,QString *themeValue,QString *iconName,DomResourceIcon *i)

{
  long lVar1;
  byte bVar2;
  Language LVar3;
  QTextStream *pQVar4;
  Uic *this_00;
  QString *in_RDX;
  QString *in_RSI;
  char *pcVar5;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  bool isCpp;
  DomResourceIcon *in_stack_00000040;
  QString *in_stack_00000048;
  QString *in_stack_00000050;
  QTextStream *in_stack_00000058;
  DomResourceIcon *in_stack_000000c8;
  QString *in_stack_000000d0;
  QString *in_stack_000000d8;
  QTextStream *in_stack_000000e0;
  WriteInitialization *in_stack_000000e8;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LVar3 = language::language();
  bVar6 = LVar3 == Cpp;
  pQVar4 = (QTextStream *)
           QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),(QString *)(in_RDI + 0x28));
  QTextStream::operator<<(pQVar4,"if ");
  if (bVar6) {
    QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),'(');
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),"QIcon");
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)language::qualifier);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"hasThemeIcon(");
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,in_RSI);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,')');
  pcVar5 = ":";
  if (bVar6) {
    pcVar5 = ") {";
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,pcVar5);
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,'\n');
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)(in_RDI + 0x40));
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,in_RDX);
  this_00 = (Uic *)QTextStream::operator<<(pQVar4," = ");
  iconFromTheme::iconFromTheme
            ((iconFromTheme *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (QString *)this_00);
  pQVar4 = CPP::operator<<((QTextStream *)
                           CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           (iconFromTheme *)this_00);
  QTextStream::operator<<(pQVar4,(QString *)language::eol);
  iconFromTheme::~iconFromTheme((iconFromTheme *)0x13d232);
  pQVar4 = (QTextStream *)
           QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),(QString *)(in_RDI + 0x28));
  pcVar5 = "else:";
  if (bVar6) {
    pcVar5 = "} else {";
  }
  pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,pcVar5);
  QTextStream::operator<<(pQVar4,'\n');
  Uic::pixmapFunction(this_00);
  bVar2 = QString::isEmpty((QString *)0x13d28f);
  QString::~QString((QString *)0x13d29d);
  if ((bVar2 & 1) == 0) {
    writePixmapFunctionIcon
              (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
               in_stack_000000c8);
  }
  else {
    writeResourceIcon(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  if (bVar6) {
    pQVar4 = (QTextStream *)
             QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),(QString *)(in_RDI + 0x28));
    QTextStream::operator<<(pQVar4,'}');
  }
  QTextStream::operator<<(*(QTextStream **)(in_RDI + 0x18),'\n');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::writeThemeIconCheckAssignment(const QString &themeValue,
                                                        const QString &iconName,
                                                        const DomResourceIcon *i)

{
    const bool isCpp = language::language() == Language::Cpp;
    m_output << m_indent << "if ";
    if (isCpp)
        m_output << '(';
    m_output << "QIcon" << language::qualifier << "hasThemeIcon("
             << themeValue << ')' << (isCpp ? ") {" : ":") << '\n'
             << m_dindent << iconName << " = " << iconFromTheme(themeValue)
             << language::eol;
    m_output << m_indent << (isCpp ? "} else {" : "else:") << '\n';
    if (m_uic->pixmapFunction().isEmpty())
        writeResourceIcon(m_output, iconName, m_dindent, i);
    else
        writePixmapFunctionIcon(m_output, iconName, m_dindent, i);
    if (isCpp)
        m_output << m_indent << '}';
    m_output  << '\n';
}